

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_attribute.h
# Opt level: O2

FixedArgSig * __thiscall
winmd::reader::NamedArgSig::parse_value
          (FixedArgSig *__return_storage_ptr__,NamedArgSig *this,database *db,byte_view *data)

{
  ElementType EVar1;
  bool bVar2;
  ElementType type;
  string_view sVar3;
  TypeDef TVar4;
  string_view type_string;
  allocator<char> local_71;
  string local_70;
  TypeDef local_50;
  string_view local_40;
  
  EVar1 = read<winmd::reader::ElementType>(data);
  if ((byte)(EVar1 + ~Property) < 0xfe) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"NamedArg must be either FIELD or PROPERTY",
               (allocator<char> *)&local_40);
    impl::throw_invalid(&local_70);
  }
  EVar1 = read<winmd::reader::ElementType>(data);
  if (EVar1 == Enum) {
    local_40 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    this->name = sVar3;
    TVar4 = cache::find(db->m_cache,&local_40);
    local_50.super_row_base<winmd::reader::TypeDef>.m_table =
         TVar4.super_row_base<winmd::reader::TypeDef>.m_table;
    local_50.super_row_base<winmd::reader::TypeDef>.m_index =
         TVar4.super_row_base<winmd::reader::TypeDef>.m_index;
    if (local_50.super_row_base<winmd::reader::TypeDef>.m_table == (table_base *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"CustomAttribute named param referenced unresolved enum type",
                 &local_71);
      impl::throw_invalid(&local_70);
    }
    bVar2 = TypeDef::is_enum(&local_50);
    if (!bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"CustomAttribute named param referenced non-enum type",
                 &local_71);
      impl::throw_invalid(&local_70);
    }
    EnumDefinition::EnumDefinition((EnumDefinition *)&local_70,&local_50);
    FixedArgSig::FixedArgSig(__return_storage_ptr__,(EnumDefinition *)&local_70,data);
  }
  else if (EVar1 == Type) {
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    this->name = sVar3;
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    *(string_view *)
     &(__return_storage_ptr__->value).
      super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
      .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
      super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_> =
         sVar3;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x28) = 0xd;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
             .super__Move_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Copy_assign_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
             .super__Move_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Copy_ctor_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>.
             super__Variant_storage_alias<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig>_>
     + 0x30) = '\0';
  }
  else {
    type = EVar1;
    if (EVar1 == SZArray) {
      type = read<winmd::reader::ElementType>(data);
    }
    if ((byte)(type - Ptr) < 0xf3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,
                 "CustomAttribute named param must be a primitive, System.Type, or an Enum",
                 (allocator<char> *)&local_40);
      impl::throw_invalid(&local_70);
    }
    sVar3 = read<std::basic_string_view<char,std::char_traits<char>>>(data);
    this->name = sVar3;
    FixedArgSig::read_arg(&__return_storage_ptr__->value,type,EVar1 == SZArray,data);
  }
  return __return_storage_ptr__;
}

Assistant:

FixedArgSig parse_value(database const& db, byte_view& data)
        {
            auto const field_or_prop = read<ElementType>(data);
            if (field_or_prop != ElementType::Field && field_or_prop != ElementType::Property)
            {
                impl::throw_invalid("NamedArg must be either FIELD or PROPERTY");
            }

            auto type = read<ElementType>(data);
            switch (type)
            {
            case ElementType::Type:
                name = read<std::string_view>(data);
                return FixedArgSig{ ElemSig::SystemType{read<std::string_view>(data)} };

            case ElementType::Enum:
            {
                auto type_string = read<std::string_view>(data);
                name = read<std::string_view>(data);
                auto type_def = db.get_cache().find(type_string);
                if (!type_def)
                {
                    impl::throw_invalid("CustomAttribute named param referenced unresolved enum type");
                }
                if (!type_def.is_enum())
                {
                    impl::throw_invalid("CustomAttribute named param referenced non-enum type");
                }

                return FixedArgSig{ type_def.get_enum_definition(), data };
            }

            default:
            {
                bool const is_array = (type == ElementType::SZArray);
                if (is_array)
                {
                    type = read<ElementType>(data);
                }
                if (type < ElementType::Boolean || ElementType::String < type)
                {
                    impl::throw_invalid("CustomAttribute named param must be a primitive, System.Type, or an Enum");
                }
                name = read<std::string_view>(data);
                return FixedArgSig{ type, is_array, data };
            }
            }
        }